

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_conn.cpp
# Opt level: O0

ssize_t __thiscall
TcpConnection::send(TcpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  EventLoop *this_00;
  int iVar1;
  undefined8 uVar2;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  anon_class_8_1_8991fb9c local_58;
  EventCallback local_50;
  int local_2c;
  byte local_25;
  int ret;
  bool should_activate_epollout;
  char *pcStack_20;
  int len_local;
  char *data_local;
  TcpConnection *this_local;
  
  pcStack_20 = (char *)CONCAT44(in_register_00000034,__fd);
  ret = (int)__buf;
  local_25 = 0;
  data_local = (char *)this;
  iVar1 = BufferBase::length(&(this->tc_obuf).super_BufferBase);
  if (iVar1 == 0) {
    local_25 = 1;
  }
  local_2c = OutputBuffer::write2buf(&this->tc_obuf,pcStack_20,ret);
  if (local_2c == 0) {
    uVar2 = 0;
    if ((local_25 & 1) == 1) {
      this_00 = this->tc_loop;
      iVar1 = this->tc_fd;
      local_58.this = this;
      std::function<void()>::function<TcpConnection::send(char_const*,int)::__0,void>
                ((function<void()> *)&local_50,&local_58);
      EventLoop::add_to_poller(this_00,iVar1,4,&local_50);
      std::function<void_()>::~function(&local_50);
      uVar2 = extraout_RAX;
    }
    this_local._7_1_ = 1;
  }
  else {
    uVar2 = 0;
    if (-1 < pr_level) {
      iVar1 = printf("[%-5s][%s:%d] send data to output buf error\n","error","send",0x44);
      uVar2 = CONCAT44(extraout_var,iVar1);
    }
    this_local._7_1_ = 0;
  }
  return CONCAT71((int7)((ulong)uVar2 >> 8),this_local._7_1_);
}

Assistant:

bool TcpConnection::send(const char *data, int len) {
    bool should_activate_epollout = false; 
    if(tc_obuf.length() == 0) {
        should_activate_epollout = true;
    }

    if (int ret = tc_obuf.write2buf(data, len); ret != 0) {
        PR_ERROR("send data to output buf error\n");
        return false;
    }

    if (should_activate_epollout == true) {
        tc_loop->add_to_poller(tc_fd,EPOLLOUT, [this](){ this->do_write(); });
    }

    return true;
}